

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_printer.hpp
# Opt level: O2

void __thiscall
Args::HelpPrinter::sortArg
          (HelpPrinter *this,ArgPtr *arg,
          vector<Args::Command_*,_std::allocator<Args::Command_*>_> *commands,
          vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *required,
          vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_> *optional,size_type *maxFlag,
          size_type *maxName,size_type *maxCommand,bool requiredAllOfGroup)

{
  ArgIface *pAVar1;
  char cVar2;
  int iVar3;
  long *plVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  Command *cmd;
  _Bind<void_(Args::HelpPrinter::*(const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
  local_d0;
  _Bind<void_(Args::HelpPrinter::*(const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool))(const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_&,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_bool)_const>
  local_80;
  
  pAVar1 = (arg->_M_t).
           super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
           super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
           super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
  if (pAVar1 == (ArgIface *)0x0) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)__dynamic_cast(pAVar1,&ArgIface::typeinfo,&GroupIface::typeinfo,0);
  }
  iVar3 = (*pAVar1->_vptr_ArgIface[2])(pAVar1);
  if (iVar3 == 0) {
    cmd = (Command *)
          (arg->_M_t).super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>
          ._M_t.super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
          super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::push_back(commands,&cmd);
    (*(cmd->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_d0);
    iVar3 = (*(cmd->super_GroupIface).super_ArgIface._vptr_ArgIface[4])();
    if ((char)iVar3 == '\0') {
      lVar6 = 0;
    }
    else {
      iVar3 = (*(cmd->super_GroupIface).super_ArgIface._vptr_ArgIface[9])();
      lVar6 = *(long *)(CONCAT44(extraout_var,iVar3) + 8) + 3;
    }
    std::__cxx11::string::~string((string *)&local_d0);
    if ((ulong)(lVar6 + local_d0._8_8_) <= *maxCommand) {
      return;
    }
    *maxCommand = lVar6 + local_d0._8_8_;
    return;
  }
  if (plVar4 == (long *)0x0) {
    iVar3 = (*((arg->_M_t).
               super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
               super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
               super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl)->_vptr_ArgIface[5])();
    if ((byte)((byte)iVar3 | requiredAllOfGroup) == 1) {
      local_d0._M_f =
           (offset_in_HelpPrinter_to_subr)
           (arg->_M_t).
           super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
           super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
           super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    }
    else {
      local_d0._M_f =
           (offset_in_HelpPrinter_to_subr)
           (arg->_M_t).
           super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
           super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
           super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
      required = optional;
    }
    std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>::emplace_back<Args::ArgIface*>
              ((vector<Args::ArgIface*,std::allocator<Args::ArgIface*>> *)required,
               (ArgIface **)&local_d0);
    pAVar1 = (arg->_M_t).
             super___uniq_ptr_impl<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>._M_t.
             super__Tuple_impl<0UL,_Args::ArgIface_*,_Args::details::Deleter<Args::ArgIface>_>.
             super__Head_base<0UL,_Args::ArgIface_*,_false>._M_head_impl;
    iVar3 = (*pAVar1->_vptr_ArgIface[8])(pAVar1);
    if (*(long *)(CONCAT44(extraout_var_00,iVar3) + 8) == 0) {
      iVar3 = (*pAVar1->_vptr_ArgIface[7])(pAVar1);
      if (*(long *)(CONCAT44(extraout_var_02,iVar3) + 8) == 0) {
        (*pAVar1->_vptr_ArgIface[3])(&local_d0,pAVar1);
        std::__cxx11::string::~string((string *)&local_d0);
        uVar7 = local_d0._8_8_;
      }
      else {
        uVar7 = 0;
      }
    }
    else {
      iVar3 = (*pAVar1->_vptr_ArgIface[8])();
      uVar7 = *(ulong *)(CONCAT44(extraout_var_01,iVar3) + 8);
    }
    iVar3 = (*pAVar1->_vptr_ArgIface[4])(pAVar1);
    uVar5 = 1;
    if ((char)iVar3 != '\0') {
      iVar3 = (*pAVar1->_vptr_ArgIface[9])(pAVar1);
      lVar6 = *(long *)(CONCAT44(extraout_var_03,iVar3) + 8);
      if (uVar7 == 0) {
        uVar5 = lVar6 + 4;
        uVar7 = 0;
      }
      else {
        uVar7 = uVar7 + lVar6 + 3;
      }
    }
    if (*maxFlag < uVar5) {
      *maxFlag = uVar5;
    }
    if (uVar7 <= *maxName) {
      return;
    }
    *maxName = uVar7;
    return;
  }
  cVar2 = (**(code **)(*plVar4 + 0x28))();
  if (cVar2 != '\0') {
    iVar3 = (**(code **)(*plVar4 + 0x10))(plVar4);
    local_80._M_bound_args.
    super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .
    super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
    .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.
    super__Tuple_impl<8UL,_bool>.super__Head_base<8UL,_bool,_false>._M_head_impl =
         (_Head_base<8UL,_bool,_false>)true;
    if (iVar3 == 4) goto LAB_00108842;
  }
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.super__Tuple_impl<8UL,_bool>.
  super__Head_base<8UL,_bool,_false>._M_head_impl = (_Head_base<8UL,_bool,_false>)false;
LAB_00108842:
  local_80._M_f = (offset_in_HelpPrinter_to_subr)sortArg;
  local_80._8_8_ = 0;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Tuple_impl<7UL,_std::reference_wrapper<unsigned_long>,_bool>.
  super__Head_base<7UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)(reference_wrapper<unsigned_long>)maxCommand;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<6UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<6UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)(reference_wrapper<unsigned_long>)maxName;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<5UL,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<5UL,_std::reference_wrapper<unsigned_long>,_false>._M_head_impl._M_data =
       (reference_wrapper<unsigned_long>)(reference_wrapper<unsigned_long>)maxFlag;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<4UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       optional;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<3UL,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       (reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>)
       required;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Tuple_impl<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .
  super__Head_base<2UL,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_false>
  ._M_head_impl._M_data =
       (reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>)
       (reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>)commands;
  local_80._M_bound_args.
  super__Tuple_impl<0UL,_const_Args::HelpPrinter_*,_std::_Placeholder<1>,_std::reference_wrapper<std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<std::vector<Args::ArgIface_*,_std::allocator<Args::ArgIface_*>_>_>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_std::reference_wrapper<unsigned_long>,_bool>
  .super__Head_base<0UL,_const_Args::HelpPrinter_*,_false>._M_head_impl = this;
  std::
  for_each<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,std::_Bind<void(Args::HelpPrinter::*(Args::HelpPrinter_const*,std::_Placeholder<1>,std::reference_wrapper<std::vector<Args::Command*,std::allocator<Args::Command*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,std::reference_wrapper<unsigned_long>,bool))(std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const&,std::vector<Args::Command*,std::allocator<Args::Command*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,std::vector<Args::ArgIface*,std::allocator<Args::ArgIface*>>&,unsigned_long&,unsigned_long&,unsigned_long&,bool)const>>
            (&local_d0,
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)plVar4[2],
             (unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)plVar4[3],
             &local_80);
  return;
}

Assistant:

inline void
HelpPrinter::sortArg( const ArgPtr & arg,
	std::vector< Command* > & commands,
	std::vector< ArgIface* > & required,
	std::vector< ArgIface* > & optional,
	String::size_type & maxFlag,
	String::size_type & maxName,
	String::size_type & maxCommand,
	bool requiredAllOfGroup ) const
{
	GroupIface * g = dynamic_cast< GroupIface* > ( arg.get() );

	if( arg->type() == ArgType::Command )
	{
		Command * cmd = static_cast< Command* > ( arg.get() );

		commands.push_back( cmd );

		String::size_type length = cmd->name().length() + ( cmd->isWithValue() ?
			3 + cmd->valueSpecifier().length() : 0 );

		if( length > maxCommand )
			maxCommand = length;
	}
	else if( g )
	{
		if( g->isRequired() && g->type() == ArgType::AllOfGroup )
			requiredAllOfGroup = true;
		else
			requiredAllOfGroup = false;

		auto f = std::bind( &HelpPrinter::sortArg, this, std::placeholders::_1,
			std::ref( commands ), std::ref( required ),
			std::ref( optional ), std::ref( maxFlag ),
			std::ref( maxName ), std::ref( maxCommand ),
			requiredAllOfGroup );

		std::for_each( g->children().cbegin(),
			g->children().cend(), f );
	}
	else
	{
		if( arg->isRequired() || requiredAllOfGroup )
			required.push_back( arg.get() );
		else
			optional.push_back( arg.get() );

		calcMaxFlagAndName( arg.get(), maxFlag, maxName );
	}
}